

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall booster::locale::calendar::calendar(calendar *this,calendar *other)

{
  int iVar1;
  undefined4 extraout_var;
  
  std::locale::locale(&this->locale_,&other->locale_);
  std::__cxx11::string::string((string *)&this->tz_,(string *)&other->tz_);
  iVar1 = (**((other->impl_).ptr_)->_vptr_abstract_calendar)();
  (this->impl_).ptr_ = (abstract_calendar *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

calendar::calendar(calendar const &other) :
    locale_(other.locale_),
    tz_(other.tz_),
    impl_(other.impl_->clone())
{
}